

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

int xmlListPushBack(xmlListPtr l,void *data)

{
  _xmlLink *p_Var1;
  _xmlLink *p_Var2;
  _xmlLink *p_Var3;
  int iVar4;
  
  iVar4 = 0;
  if (l != (xmlListPtr)0x0) {
    p_Var1 = l->sentinel->prev;
    p_Var3 = (_xmlLink *)(*xmlMalloc)(0x18);
    iVar4 = 0;
    if (p_Var3 != (_xmlLink *)0x0) {
      p_Var3->data = data;
      p_Var2 = p_Var1->next;
      p_Var3->next = p_Var2;
      p_Var2->prev = p_Var3;
      p_Var1->next = p_Var3;
      p_Var3->prev = p_Var1;
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

int
xmlListPushBack(xmlListPtr l, void *data)
{
    xmlLinkPtr lkPlace, lkNew;

    if (l == NULL)
        return(0);
    lkPlace = l->sentinel->prev;
    /* Add the new link */
    lkNew = (xmlLinkPtr)xmlMalloc(sizeof(xmlLink));
    if (lkNew == NULL)
        return (0);
    lkNew->data = data;
    lkNew->next = lkPlace->next;
    (lkPlace->next)->prev = lkNew;
    lkPlace->next = lkNew;
    lkNew->prev = lkPlace;
    return 1;
}